

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O1

void __thiscall cppcms::rpc::json_rpc_server::smd(json_rpc_server *this,value *v)

{
  ostringstream ss;
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  json::operator<<((ostream *)local_190,v);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->smd_,(string *)local_1b0);
  if (local_1b0[0] != local_1a0) {
    operator_delete(local_1b0[0]);
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void json_rpc_server::smd(json::value const &v)
	{
		std::ostringstream ss;
		ss<<v;
		smd_=ss.str();
	}